

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshortcut_widgets.cpp
# Opt level: O3

bool correctGraphicsWidgetContext(ShortcutContext context,QGraphicsWidget *w,QWidget *active_window)

{
  bool bVar1;
  WindowType WVar2;
  QGraphicsScene *pQVar3;
  QGraphicsScene *pQVar4;
  QGraphicsItem *pQVar5;
  QGraphicsItem *pQVar6;
  QWidget *pQVar7;
  QGraphicsWidget *pQVar8;
  QGraphicsWidget *pQVar9;
  long lVar10;
  long in_FS_OFFSET;
  bool bVar11;
  QList<QGraphicsView_*> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (active_window != (QWidget *)0x0) {
    pQVar5 = &(w->super_QGraphicsObject).super_QGraphicsItem;
    bVar1 = QGraphicsItem::isVisible(pQVar5);
    if (((bVar1) && (bVar1 = QGraphicsItem::isEnabled(pQVar5), bVar1)) &&
       (pQVar3 = QGraphicsItem::scene(pQVar5), pQVar3 != (QGraphicsScene *)0x0)) {
      if (context == WidgetShortcut) {
        pQVar4 = (QGraphicsScene *)QGraphicsItem::scene(pQVar5);
        pQVar6 = QGraphicsScene::focusItem(pQVar4);
        bVar1 = pQVar5 == pQVar6;
        goto LAB_0039e56c;
      }
      if (context == WidgetWithChildrenShortcut) {
        pQVar4 = (QGraphicsScene *)QGraphicsItem::scene(pQVar5);
        pQVar5 = QGraphicsScene::focusItem(pQVar4);
        if ((pQVar5 != (QGraphicsItem *)0x0) && (bVar1 = QGraphicsItem::isWidget(pQVar5), bVar1)) {
          pQVar8 = (QGraphicsWidget *)(pQVar5 + -1);
          if (pQVar8 == w) {
            bVar1 = true;
          }
          else {
            do {
              WVar2 = QGraphicsWidget::windowType((QGraphicsWidget *)pQVar8);
              if ((WVar2 != Widget) &&
                 (WVar2 = QGraphicsWidget::windowType((QGraphicsWidget *)pQVar8), WVar2 != Popup))
              goto LAB_0039e56a;
              pQVar8 = QGraphicsItem::parentWidget
                                 (&(pQVar8->super_QGraphicsObject).super_QGraphicsItem);
              bVar1 = pQVar8 == w;
            } while ((pQVar8 != (QGraphicsWidget *)0x0) && (pQVar8 != w));
          }
          goto LAB_0039e56c;
        }
        goto LAB_0039e56a;
      }
      if (context == ApplicationShortcut) {
        pQVar4 = (QGraphicsScene *)QGraphicsItem::scene(pQVar5);
        QGraphicsScene::views(&local_50,pQVar4);
        if (local_50.d.size == 0) goto LAB_0039e5ed;
        lVar10 = 0;
        do {
          bVar1 = QApplicationPrivate::tryModalHelper
                            (*(QWidget **)((long)local_50.d.ptr + lVar10),(QWidget **)0x0);
          if (bVar1) break;
          bVar11 = local_50.d.size * 8 + -8 != lVar10;
          lVar10 = lVar10 + 8;
        } while (bVar11);
      }
      else {
        pQVar4 = (QGraphicsScene *)QGraphicsItem::scene(pQVar5);
        QGraphicsScene::views(&local_50,pQVar4);
        if (local_50.d.size != 0) {
          lVar10 = 0;
          do {
            pQVar7 = QWidget::window(*(QWidget **)((long)local_50.d.ptr + lVar10));
            if (pQVar7 == active_window) {
              pQVar4 = (QGraphicsScene *)QGraphicsItem::scene(pQVar5);
              pQVar8 = QGraphicsScene::activeWindow(pQVar4);
              pQVar9 = QGraphicsItem::window(pQVar5);
              if (pQVar9 == (QGraphicsWidget *)0x0) {
                bVar1 = true;
              }
              else {
                pQVar9 = QGraphicsItem::window(pQVar5);
                bVar1 = pQVar8 == pQVar9;
              }
              goto LAB_0039e5ef;
            }
            lVar10 = lVar10 + 8;
          } while (local_50.d.size << 3 != lVar10);
        }
LAB_0039e5ed:
        bVar1 = false;
      }
LAB_0039e5ef:
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,8,0x10);
        }
      }
      goto LAB_0039e56c;
    }
  }
LAB_0039e56a:
  bVar1 = false;
LAB_0039e56c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

static bool correctGraphicsWidgetContext(Qt::ShortcutContext context, QGraphicsWidget *w, QWidget *active_window)
{
    if (!active_window)
        return false;

    bool visible = w->isVisible();
#if defined(Q_OS_DARWIN) && QT_CONFIG(menubar)
    if (!QCoreApplication::testAttribute(Qt::AA_DontUseNativeMenuBar) && qobject_cast<QMenuBar *>(w))
        visible = true;
#endif

    if (!visible || !w->isEnabled() || !w->scene())
        return false;

    if (context == Qt::ApplicationShortcut) {
        // Applicationwide shortcuts are always reachable unless their owner
        // is shadowed by modality. In QGV there's no modality concept, but we
        // must still check if all views are shadowed.
        const auto &views = w->scene()->views();
        for (auto view : views) {
            if (QApplicationPrivate::tryModalHelper(view, nullptr))
                return true;
        }
        return false;
    }

    if (context == Qt::WidgetShortcut)
        return static_cast<QGraphicsItem *>(w) == w->scene()->focusItem();

    if (context == Qt::WidgetWithChildrenShortcut) {
        const QGraphicsItem *ti = w->scene()->focusItem();
        if (ti && ti->isWidget()) {
            const auto *tw = static_cast<const QGraphicsWidget *>(ti);
            while (tw && tw != w && (tw->windowType() == Qt::Widget || tw->windowType() == Qt::Popup))
                tw = tw->parentWidget();
            return tw == w;
        }
        return false;
    }

    // Below is Qt::WindowShortcut context

    // Find the active view (if any).
    const auto &views = w->scene()->views();
    QGraphicsView *activeView = nullptr;
    for (auto view : views) {
        if (view->window() == active_window) {
            activeView = view;
            break;
        }
    }
    if (!activeView)
        return false;

    // The shortcut is reachable if owned by a windowless widget, or if the
    // widget's window is the same as the focus item's window.
    QGraphicsWidget *a = w->scene()->activeWindow();
    return !w->window() || a == w->window();
}